

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XDataAllocator.cpp
# Opt level: O0

void __thiscall
Memory::XDataAllocator::Release(XDataAllocator *this,SecondaryAllocation *allocation)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  HeapAllocator *alloc;
  XDataAllocationEntry *this_00;
  TrackAllocData local_50;
  XDataAllocationEntry *freed;
  XDataAllocation *xdata;
  SecondaryAllocation *allocation_local;
  XDataAllocator *this_local;
  
  freed = (XDataAllocationEntry *)allocation;
  xdata = (XDataAllocation *)allocation;
  allocation_local = (SecondaryAllocation *)this;
  if (allocation->address == (BYTE *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/amd64/XDataAllocator.cpp"
                       ,0x58,"(allocation.address)","allocation.address");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&XDataAllocationEntry::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/amd64/XDataAllocator.cpp"
             ,0x5a);
  alloc = HeapAllocator::TrackAllocInfo(&HeapAllocator::Instance,&local_50);
  this_00 = (XDataAllocationEntry *)new<Memory::HeapAllocator>(0x10,alloc,true,0x469be0);
  XDataAllocationEntry::XDataAllocationEntry(this_00);
  if (this_00 != (XDataAllocationEntry *)0x0) {
    (this_00->super_XDataAllocation).super_SecondaryAllocation.address =
         (freed->super_XDataAllocation).super_SecondaryAllocation.address;
    this_00->next = this->freeList;
    this->freeList = this_00;
  }
  return;
}

Assistant:

void XDataAllocator::Release(const SecondaryAllocation& allocation)
{
    const XDataAllocation& xdata = static_cast<const XDataAllocation&>(allocation);
    Assert(allocation.address);
    // Add it to free list
    auto freed = HeapNewNoThrowStruct(XDataAllocationEntry);
    if(freed)
    {
        freed->address = xdata.address;
        freed->next = this->freeList;
        this->freeList = freed;
    }
}